

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswMan.c
# Opt level: O3

Ssw_Man_t * Ssw_ManCreate(Aig_Man_t *pAig,Ssw_Pars_t *pPars)

{
  uint uVar1;
  Ssw_Man_t *pSVar2;
  Aig_Obj_t **ppAVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  uint *puVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  int iVar9;
  long lVar10;
  
  if (0 < pAig->nRegs) {
    Aig_ManFanoutStart(pAig);
    Aig_ManSetCioIds(pAig);
    pSVar2 = (Ssw_Man_t *)calloc(1,0x1a8);
    pSVar2->pPars = pPars;
    pSVar2->pAig = pAig;
    lVar10 = (long)pPars->nFramesK + 1;
    iVar9 = (int)lVar10;
    pSVar2->nFrames = iVar9;
    ppAVar3 = (Aig_Obj_t **)calloc(pAig->vObjs->nSize * lVar10,8);
    pSVar2->pNodeToFrames = ppAVar3;
    pVVar4 = (Vec_Ptr_t *)malloc(0x10);
    pVVar4->nCap = 100;
    pVVar4->nSize = 0;
    ppvVar5 = (void **)malloc(800);
    pVVar4->pArray = ppvVar5;
    pSVar2->vCommon = pVVar4;
    pSVar2->iOutputLit = -1;
    uVar1 = pAig->nTruePis * iVar9 + pAig->nRegs;
    iVar9 = (((int)uVar1 >> 5) + 1) - (uint)((uVar1 & 0x1f) == 0);
    pSVar2->nPatWords = iVar9;
    puVar6 = (uint *)calloc((long)iVar9,4);
    pSVar2->pPatWords = puVar6;
    pVVar4 = (Vec_Ptr_t *)malloc(0x10);
    pVVar4->nCap = 100;
    pVVar4->nSize = 0;
    ppvVar5 = (void **)malloc(800);
    pVVar4->pArray = ppvVar5;
    pSVar2->vNewLos = pVVar4;
    pVVar7 = (Vec_Int_t *)malloc(0x10);
    pVVar7->nCap = 100;
    pVVar7->nSize = 0;
    piVar8 = (int *)malloc(400);
    pVVar7->pArray = piVar8;
    pSVar2->vNewPos = pVVar7;
    pVVar4 = (Vec_Ptr_t *)malloc(0x10);
    pVVar4->nCap = 100;
    pVVar4->nSize = 0;
    ppvVar5 = (void **)malloc(800);
    pVVar4->pArray = ppvVar5;
    pSVar2->vResimConsts = pVVar4;
    pVVar4 = (Vec_Ptr_t *)malloc(0x10);
    pVVar4->nCap = 100;
    pVVar4->nSize = 0;
    ppvVar5 = (void **)malloc(800);
    pVVar4->pArray = ppvVar5;
    pSVar2->vResimClasses = pVVar4;
    return pSVar2;
  }
  __assert_fail("Saig_ManRegNum(pAig) > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswMan.c"
                ,0x31,"Ssw_Man_t *Ssw_ManCreate(Aig_Man_t *, Ssw_Pars_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates the manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Ssw_Man_t * Ssw_ManCreate( Aig_Man_t * pAig, Ssw_Pars_t * pPars )
{
    Ssw_Man_t * p;
    // prepare the sequential AIG
    assert( Saig_ManRegNum(pAig) > 0 );
    Aig_ManFanoutStart( pAig );
    Aig_ManSetCioIds( pAig );
    // create interpolation manager
    p = ABC_ALLOC( Ssw_Man_t, 1 );
    memset( p, 0, sizeof(Ssw_Man_t) );
    p->pPars         = pPars;
    p->pAig          = pAig;
    p->nFrames       = pPars->nFramesK + 1;
    p->pNodeToFrames = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p->pAig) * p->nFrames );
    p->vCommon       = Vec_PtrAlloc( 100 );
    p->iOutputLit    = -1;
    // allocate storage for sim pattern
    p->nPatWords     = Abc_BitWordNum( Saig_ManPiNum(pAig) * p->nFrames + Saig_ManRegNum(pAig) );
    p->pPatWords     = ABC_CALLOC( unsigned, p->nPatWords );
    // other
    p->vNewLos       = Vec_PtrAlloc( 100 );
    p->vNewPos       = Vec_IntAlloc( 100 );
    p->vResimConsts  = Vec_PtrAlloc( 100 );
    p->vResimClasses = Vec_PtrAlloc( 100 );
//    p->pPars->fVerbose = 1;
    return p;
}